

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

float getSpline(Spline *sp,float *vals)

{
  float fVar1;
  uint uVar2;
  Spline *sp_00;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (sp != (Spline *)0x0) {
    uVar2 = sp->len;
    if (0xfffffff4 < uVar2 - 0xc) {
      if (uVar2 == 1) {
        fVar6 = (float)sp->typ;
      }
      else {
        fVar1 = vals[sp->typ];
        uVar4 = 0;
        do {
          if (fVar1 <= sp->loc[uVar4]) goto LAB_00121682;
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
        uVar4 = (ulong)uVar2;
LAB_00121682:
        uVar3 = (uint)uVar4;
        if (uVar3 == 0) {
          lVar5 = 0;
        }
        else {
          if (uVar3 != uVar2) {
            uVar4 = uVar4 & 0xffffffff;
            sp_00 = sp->val[uVar4];
            fVar10 = sp->loc[uVar4] - sp->loc[(long)(int)uVar3 + -1];
            fVar9 = (fVar1 - sp->loc[(long)(int)uVar3 + -1]) / fVar10;
            fVar1 = sp->der[uVar4];
            fVar6 = sp->loc[(long)(int)uVar3 + 0xb];
            fVar7 = getSpline(sp->val[(long)(int)uVar3 + -1],vals);
            fVar8 = getSpline(sp_00,vals);
            fVar6 = -(fVar8 - fVar7) + fVar10 * fVar6;
            return ((((fVar8 - fVar7) + fVar10 * -fVar1) - fVar6) * fVar9 + fVar6) *
                   (1.0 - fVar9) * fVar9 + (fVar8 - fVar7) * fVar9 + fVar7;
          }
          lVar5 = (long)(int)(uVar2 - 1);
        }
        fVar6 = getSpline(sp->val[lVar5],vals);
        fVar6 = fVar6 + (fVar1 - sp->loc[lVar5]) * sp->der[lVar5];
      }
      return fVar6;
    }
  }
  puts("getSpline(): bad parameters");
  exit(1);
}

Assistant:

float getSpline(const Spline *sp, const float *vals)
{
    if (!sp || sp->len <= 0 || sp->len >= 12)
    {
        printf("getSpline(): bad parameters\n");
        exit(1);
    }

    if (sp->len == 1)
        return ((FixSpline*)sp)->val;

    float f = vals[sp->typ];
    int i;

    for (i = 0; i < sp->len; i++)
        if (sp->loc[i] >= f)
            break;
    if (i == 0 || i == sp->len)
    {
        if (i) i--;
        float v = getSpline(sp->val[i], vals);
        return v + sp->der[i] * (f - sp->loc[i]);
    }
    const Spline *sp1 = sp->val[i-1];
    const Spline *sp2 = sp->val[i];
    float g = sp->loc[i-1];
    float h = sp->loc[i];
    float k = (f - g) / (h - g);
    float l = sp->der[i-1];
    float m = sp->der[i];
    float n = getSpline(sp1, vals);
    float o = getSpline(sp2, vals);
    float p = l * (h - g) - (o - n);
    float q = -m * (h - g) + (o - n);
    float r = lerp(k, n, o) + k * (1.0F - k) * lerp(k, p, q);
    return r;
}